

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall despot::Solver::BeliefUpdate(Solver *this,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  log_ostream *this_00;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  timeval tv;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  dVar3 = (double)local_30.tv_sec;
  dVar4 = (double)local_30.tv_usec;
  (*this->belief_->_vptr_Belief[3])(this->belief_,action,obs);
  History::Add(&this->history_,action,obs);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      this_00 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&this_00->super_ostream,
                 "[Solver::Update] Updated belief, history and root with action ",0x3e);
      poVar2 = (ostream *)std::ostream::operator<<(this_00,action);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", observation ",0xe);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," in ",4);
      gettimeofday(&local_30,(__timezone_ptr_t)0x0);
      poVar2 = std::ostream::_M_insert<double>
                         (((double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) -
                          (dVar4 / 1000000.0 + dVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"s",1);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void Solver::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	double start = get_time_second();

	belief_->Update(action, obs);
	history_.Add(action, obs);

	logi << "[Solver::Update] Updated belief, history and root with action "
		<< action << ", observation " << obs
		<< " in " << (get_time_second() - start) << "s" << endl;
}